

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

double RoundScalarWithFormat<double,double>(char *format,ImGuiDataType data_type,double v)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 local_50;
  char v_str [64];
  
  local_50 = v;
  pcVar2 = ImParseFormatFindStart(format);
  if ((*pcVar2 == '%') && (pcVar2[1] != '%')) {
    ImFormatString(v_str,0x40,pcVar2,local_50);
    pcVar2 = (char *)((long)&local_50 + 7);
    do {
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 == ' ');
    local_50 = atof(pcVar2);
  }
  return local_50;
}

Assistant:

static inline TYPE RoundScalarWithFormat(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}